

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolData.cpp
# Opt level: O0

void __thiscall SymbolData::writeNocashSym(SymbolData *this)

{
  undefined8 uVar1;
  SymDataSymbol *pSVar2;
  SymDataModule *pSVar3;
  bool bVar4;
  uint uVar5;
  SymDataModule *pSVar6;
  SymDataSymbol *pSVar7;
  size_type sVar8;
  reference pvVar9;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __result;
  set<SymDataData,_std::less<SymDataData>,_std::allocator<SymDataData>_> *this_00;
  iterator __first_00;
  path *this_01;
  reference args;
  reference pvVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_00;
  void *__buf;
  int __fd;
  unsigned_long *in_R8;
  ulong local_4c0;
  size_t i_1;
  string local_4b0;
  undefined1 local_490 [8];
  TextFile file;
  string local_1b8;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  undefined1 local_118 [8];
  NocashSymEntry entry_1;
  SymDataData *data;
  iterator __end2;
  iterator __begin2;
  set<SymDataData,_std::less<SymDataData>,_std::allocator<SymDataData>_> *__range2;
  string local_a0;
  undefined1 local_80 [8];
  NocashSymEntry entry;
  size_t f;
  size_t size;
  SymDataSymbol *sym;
  size_t i;
  SymDataModule *module;
  size_t k;
  vector<NocashSymEntry,_std::allocator<NocashSymEntry>_> entries;
  SymbolData *this_local;
  
  entries.super__Vector_base<NocashSymEntry,_std::allocator<NocashSymEntry>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  bVar4 = ghc::filesystem::path::empty(&this->nocashSymFileName);
  if (!bVar4) {
    std::vector<NocashSymEntry,_std::allocator<NocashSymEntry>_>::vector
              ((vector<NocashSymEntry,_std::allocator<NocashSymEntry>_> *)&k);
    for (module = (SymDataModule *)0x0; pSVar3 = module,
        pSVar6 = (SymDataModule *)
                 std::vector<SymDataModule,_std::allocator<SymDataModule>_>::size(&this->modules),
        pSVar3 < pSVar6; module = (SymDataModule *)((long)&module->file + 1)) {
      i = (size_t)std::vector<SymDataModule,_std::allocator<SymDataModule>_>::operator[]
                            (&this->modules,(size_type)module);
      for (sym = (SymDataSymbol *)0x0; pSVar2 = sym,
          pSVar7 = (SymDataSymbol *)
                   std::vector<SymDataSymbol,_std::allocator<SymDataSymbol>_>::size
                             ((vector<SymDataSymbol,_std::allocator<SymDataSymbol>_> *)(i + 8)),
          pSVar2 < pSVar7; sym = (SymDataSymbol *)&(sym->name).field_0x1) {
        size = (size_t)std::vector<SymDataSymbol,_std::allocator<SymDataSymbol>_>::operator[]
                                 ((vector<SymDataSymbol,_std::allocator<SymDataSymbol>_> *)(i + 8),
                                  (size_type)sym);
        f = 0;
        for (entry.text.field_2._8_8_ = 0; uVar1 = entry.text.field_2._8_8_,
            sVar8 = std::vector<SymDataFunction,_std::allocator<SymDataFunction>_>::size
                              ((vector<SymDataFunction,_std::allocator<SymDataFunction>_> *)
                               (i + 0x20)), (ulong)uVar1 < sVar8;
            entry.text.field_2._8_8_ = entry.text.field_2._8_8_ + 1) {
          pvVar9 = std::vector<SymDataFunction,_std::allocator<SymDataFunction>_>::operator[]
                             ((vector<SymDataFunction,_std::allocator<SymDataFunction>_> *)
                              (i + 0x20),entry.text.field_2._8_8_);
          if (pvVar9->address == *(long *)(size + 0x20)) {
            pvVar9 = std::vector<SymDataFunction,_std::allocator<SymDataFunction>_>::operator[]
                               ((vector<SymDataFunction,_std::allocator<SymDataFunction>_> *)
                                (i + 0x20),entry.text.field_2._8_8_);
            f = pvVar9->size;
            break;
          }
        }
        NocashSymEntry::NocashSymEntry((NocashSymEntry *)local_80);
        local_80 = *(undefined1 (*) [8])(size + 0x20);
        if ((f == 0) || (this->nocashSymVersion < 2)) {
          std::__cxx11::string::operator=((string *)&entry,(string *)size);
        }
        else {
          tinyformat::format<std::__cxx11::string,unsigned_long>
                    (&local_a0,(tinyformat *)"%s,%08X",(char *)size,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f,in_R8);
          std::__cxx11::string::operator=((string *)&entry,(string *)&local_a0);
          std::__cxx11::string::~string((string *)&local_a0);
        }
        if (this->nocashSymVersion == 1) {
          __first._M_current = (char *)std::__cxx11::string::begin();
          __last._M_current = (char *)std::__cxx11::string::end();
          __result._M_current = (char *)std::__cxx11::string::begin();
          std::
          transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)noexcept>
                    (__first,__last,__result,tolower);
        }
        std::vector<NocashSymEntry,_std::allocator<NocashSymEntry>_>::push_back
                  ((vector<NocashSymEntry,_std::allocator<NocashSymEntry>_> *)&k,
                   (value_type *)local_80);
        NocashSymEntry::~NocashSymEntry((NocashSymEntry *)local_80);
      }
      this_00 = (set<SymDataData,_std::less<SymDataData>,_std::allocator<SymDataData>_> *)(i + 0x38)
      ;
      __end2 = std::set<SymDataData,_std::less<SymDataData>,_std::allocator<SymDataData>_>::begin
                         (this_00);
      data = (SymDataData *)
             std::set<SymDataData,_std::less<SymDataData>,_std::allocator<SymDataData>_>::end
                       (this_00);
      while (bVar4 = std::operator!=(&__end2,(_Self *)&data), bVar4) {
        entry_1.text.field_2._8_8_ = std::_Rb_tree_const_iterator<SymDataData>::operator*(&__end2);
        NocashSymEntry::NocashSymEntry((NocashSymEntry *)local_118);
        local_118 = *(undefined1 (*) [8])entry_1.text.field_2._8_8_;
        switch(*(undefined4 *)(entry_1.text.field_2._8_8_ + 0x10)) {
        case 0:
          tinyformat::format<unsigned_long>
                    (&local_138,".byt:%04X",(unsigned_long *)(entry_1.text.field_2._8_8_ + 8));
          std::__cxx11::string::operator=((string *)&entry_1,(string *)&local_138);
          std::__cxx11::string::~string((string *)&local_138);
          break;
        case 1:
          tinyformat::format<unsigned_long>
                    (&local_158,".wrd:%04X",(unsigned_long *)(entry_1.text.field_2._8_8_ + 8));
          std::__cxx11::string::operator=((string *)&entry_1,(string *)&local_158);
          std::__cxx11::string::~string((string *)&local_158);
          break;
        case 2:
          tinyformat::format<unsigned_long>
                    (&local_178,".dbl:%04X",(unsigned_long *)(entry_1.text.field_2._8_8_ + 8));
          std::__cxx11::string::operator=((string *)&entry_1,(string *)&local_178);
          std::__cxx11::string::~string((string *)&local_178);
          break;
        case 3:
          tinyformat::format<unsigned_long>
                    (&local_198,".dbl:%04X",(unsigned_long *)(entry_1.text.field_2._8_8_ + 8));
          std::__cxx11::string::operator=((string *)&entry_1,(string *)&local_198);
          std::__cxx11::string::~string((string *)&local_198);
          break;
        case 4:
          tinyformat::format<unsigned_long>
                    (&local_1b8,".asc:%04X",(unsigned_long *)(entry_1.text.field_2._8_8_ + 8));
          std::__cxx11::string::operator=((string *)&entry_1,(string *)&local_1b8);
          std::__cxx11::string::~string((string *)&local_1b8);
        }
        std::vector<NocashSymEntry,_std::allocator<NocashSymEntry>_>::push_back
                  ((vector<NocashSymEntry,_std::allocator<NocashSymEntry>_> *)&k,
                   (value_type *)local_118);
        NocashSymEntry::~NocashSymEntry((NocashSymEntry *)local_118);
        std::_Rb_tree_const_iterator<SymDataData>::operator++(&__end2);
      }
    }
    __first_00 = std::vector<NocashSymEntry,_std::allocator<NocashSymEntry>_>::begin
                           ((vector<NocashSymEntry,_std::allocator<NocashSymEntry>_> *)&k);
    file.bufPos = (size_t)std::vector<NocashSymEntry,_std::allocator<NocashSymEntry>_>::end
                                    ((vector<NocashSymEntry,_std::allocator<NocashSymEntry>_> *)&k);
    std::
    sort<__gnu_cxx::__normal_iterator<NocashSymEntry*,std::vector<NocashSymEntry,std::allocator<NocashSymEntry>>>>
              ((__normal_iterator<NocashSymEntry_*,_std::vector<NocashSymEntry,_std::allocator<NocashSymEntry>_>_>
                )__first_00._M_current,
               (__normal_iterator<NocashSymEntry_*,_std::vector<NocashSymEntry,_std::allocator<NocashSymEntry>_>_>
                )file.bufPos);
    TextFile::TextFile((TextFile *)local_490);
    args_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    uVar5 = TextFile::open((TextFile *)local_490,(char *)this,1);
    if ((uVar5 & 1) == 0) {
      this_01 = TextFile::getFileName((TextFile *)local_490);
      ghc::filesystem::path::u8string_abi_cxx11_(&local_4b0,this_01);
      Logger::printError<std::__cxx11::string>((Logger *)0x1,0x221b50,(char *)&local_4b0,args_00);
      std::__cxx11::string::~string((string *)&local_4b0);
    }
    else {
      TextFile::writeLine((TextFile *)local_490,"00000000 0");
      for (local_4c0 = 0;
          sVar8 = std::vector<NocashSymEntry,_std::allocator<NocashSymEntry>_>::size
                            ((vector<NocashSymEntry,_std::allocator<NocashSymEntry>_> *)&k),
          local_4c0 < sVar8; local_4c0 = local_4c0 + 1) {
        args = std::vector<NocashSymEntry,_std::allocator<NocashSymEntry>_>::operator[]
                         ((vector<NocashSymEntry,_std::allocator<NocashSymEntry>_> *)&k,local_4c0);
        pvVar10 = std::vector<NocashSymEntry,_std::allocator<NocashSymEntry>_>::operator[]
                            ((vector<NocashSymEntry,_std::allocator<NocashSymEntry>_> *)&k,local_4c0
                            );
        TextFile::writeFormat<long,std::__cxx11::string>
                  ((TextFile *)local_490,"%08X %s\n",&args->address,&pvVar10->text);
      }
      __fd = 0x221b80;
      TextFile::write((TextFile *)local_490,0x221b80,__buf,sVar8);
      TextFile::close((TextFile *)local_490,__fd);
    }
    TextFile::~TextFile((TextFile *)local_490);
    std::vector<NocashSymEntry,_std::allocator<NocashSymEntry>_>::~vector
              ((vector<NocashSymEntry,_std::allocator<NocashSymEntry>_> *)&k);
  }
  return;
}

Assistant:

void SymbolData::writeNocashSym()
{
	if (nocashSymFileName.empty())
		return;

	std::vector<NocashSymEntry> entries;
	for (size_t k = 0; k < modules.size(); k++)
	{
		SymDataModule& module = modules[k];
		for (size_t i = 0; i < module.symbols.size(); i++)
		{
			SymDataSymbol& sym = module.symbols[i];
			
			size_t size = 0;
			for (size_t f = 0; f < module.functions.size(); f++)
			{
				if (module.functions[f].address == sym.address)
				{
					size = module.functions[f].size;
					break;
				}
			}

			NocashSymEntry entry;
			entry.address = sym.address;

			if (size != 0 && nocashSymVersion >= 2)
				entry.text = tfm::format("%s,%08X",sym.name,size);
			else
				entry.text = sym.name;

			if (nocashSymVersion == 1)
				std::transform(entry.text.begin(), entry.text.end(), entry.text.begin(), ::tolower);

			entries.push_back(entry);
		}

		for (const SymDataData& data: module.data)
		{
			NocashSymEntry entry;
			entry.address = data.address;

			switch (data.type)
			{
			case Data8:
				entry.text = tfm::format(".byt:%04X",data.size);
				break;
			case Data16:
				entry.text = tfm::format(".wrd:%04X",data.size);
				break;
			case Data32:
				entry.text = tfm::format(".dbl:%04X",data.size);
				break;
			case Data64:
				entry.text = tfm::format(".dbl:%04X",data.size);
				break;
			case DataAscii:
				entry.text = tfm::format(".asc:%04X",data.size);
				break;
			}

			entries.push_back(entry);
		}
	}

	std::sort(entries.begin(),entries.end());
	
	TextFile file;
	if (!file.open(nocashSymFileName,TextFile::Write,TextFile::ASCII))
	{
		Logger::printError(Logger::Error, "Could not open sym file %s.",file.getFileName().u8string());
		return;
	}
	file.writeLine("00000000 0");

	for (size_t i = 0; i < entries.size(); i++)
	{
		file.writeFormat("%08X %s\n",entries[i].address,entries[i].text);
	}

	file.write("\x1A");
	file.close();
}